

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGPOMDPPlanner.cpp
# Opt level: O2

QFunctionsDiscrete * __thiscall
PerseusBGPOMDPPlanner::BackupStageSamplingAlt
          (QFunctionsDiscrete *__return_storage_ptr__,PerseusBGPOMDPPlanner *this,BeliefSet *S,
          QFunctionsDiscrete *Q)

{
  _func_int *p_Var1;
  JointBeliefInterface *pJVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ostream *poVar9;
  uint uVar10;
  ulong uVar11;
  PlanningUnitMADPDiscrete *this_00;
  long lVar12;
  int b;
  size_type __n;
  double dVar13;
  reference rVar14;
  ulong local_248;
  vector<double,_std::allocator<double>_> VBalpha;
  vector<double,_std::allocator<double>_> VB;
  ValueFunctionPOMDPDiscrete Qalphas;
  AlphaVector alpha;
  ValueFunctionPOMDPDiscrete V;
  vector<bool,_std::allocator<bool>_> stillNeedToBeImproved;
  AlphaVector local_180;
  _Bvector_base<std::allocator<bool>_> local_158;
  GaoVectorSet Gao;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  local_b0;
  
  BeliefValue::GetValues(&VB,S,Q);
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_Var1 = (this->super_PerseusQFunctionPlanner).super_PerseusStationary.super_Perseus._vptr_Perseus
           [-3];
  this_00 = *(PlanningUnitMADPDiscrete **)
             ((long)&(this->super_PerseusQFunctionPlanner).super_PerseusStationary.super_Perseus.
                     _m_verbose + (long)p_Var1);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               ((long)&(this->super_PerseusQFunctionPlanner).super_PerseusStationary.super_Perseus.
                       _m_bestValue + (long)p_Var1);
  }
  local_248 = (long)VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
  sVar5 = PlanningUnitMADPDiscrete::GetNrStates(this_00);
  local_248 = local_248 >> 3;
  Gao.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&stillNeedToBeImproved,(long)(int)local_248,(bool *)&Gao,(allocator_type *)&alpha);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,
           ((long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(Q->
                 super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&Gao);
  AlphaVector::AlphaVector(&alpha,(long)(int)sVar5);
  AlphaVectorPlanning::QFunctionsToValueFunction(&V,Q);
  Perseus::BackupStageLeadIn(&Gao,(Perseus *)this,&V);
  Qalphas.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Qalphas.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Qalphas.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = local_248 & 0xffffffff;
  lVar12 = -1;
  while ((int)local_248 != 0) {
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear(&Qalphas);
    uVar10 = 0;
    while( true ) {
      p_Var1 = (this->super_PerseusQFunctionPlanner).super_PerseusStationary.super_Perseus.
               _vptr_Perseus[-3];
      lVar7 = *(long *)((long)&(this->super_PerseusQFunctionPlanner).super_PerseusStationary.
                               super_Perseus._m_verbose + (long)p_Var1);
      if (lVar7 == 0) {
        lVar7 = *(long *)((long)&(this->super_PerseusQFunctionPlanner).super_PerseusStationary.
                                 super_Perseus._m_bestValue + (long)p_Var1);
      }
      uVar8 = (**(code **)(**(long **)(lVar7 + 0x30) + 0x68))();
      uVar11 = (ulong)uVar10;
      if (uVar8 == uVar11) break;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_158,&stillNeedToBeImproved);
      iVar4 = Perseus::SampleNotImprovedBeliefIndex
                        ((Perseus *)this,(vector<bool,_std::allocator<bool>_> *)&local_158,
                         (int)local_248);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_158);
      lVar12 = (long)iVar4;
      (*(this->super_PerseusQFunctionPlanner).super_PerseusStationary.super_Perseus._vptr_Perseus
        [0xf])(&local_180,this,
               (S->
               super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>).
               _M_impl.super__Vector_impl_data._M_start[lVar12],uVar11,&Gao,Q);
      AlphaVector::operator=(&alpha,&local_180);
      AlphaVector::~AlphaVector(&local_180);
      pJVar2 = (S->
               super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>).
               _M_impl.super__Vector_impl_data._M_start[lVar12];
      dVar13 = (double)(**(code **)(*(long *)((long)&pJVar2->field_0x0 +
                                             *(long *)((long)*pJVar2 + -0xb8)) + 0x80))
                                 ((long)&pJVar2->field_0x0 + *(long *)((long)*pJVar2 + -0xb8),
                                  &alpha._m_values);
      if (VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar12] <= dVar13) {
        if ((this->super_PerseusQFunctionPlanner).super_PerseusStationary.super_Perseus._m_verbose
            != 0) {
          poVar9 = std::operator<<((ostream *)&std::cout,"Added vector for action ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9,", belief ");
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar4);
          std::operator<<(poVar9," (Q ");
          poVar9 = std::ostream::_M_insert<double>(dVar13);
          std::operator<<(poVar9," >= ");
          poVar9 = std::ostream::_M_insert<double>
                             (VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar12]);
          poVar9 = std::operator<<(poVar9,")");
          std::endl<char,std::char_traits<char>>(poVar9);
        }
      }
      else {
        BeliefValue::GetMaximizingVector
                  (&local_180,S,iVar4,
                   (Q->
                   super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar11);
        AlphaVector::operator=(&alpha,&local_180);
        AlphaVector::~AlphaVector(&local_180);
      }
      bVar3 = AlphaVectorPlanning::VectorIsInValueFunction
                        (&alpha,(__return_storage_ptr__->
                                super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar11);
      if (!bVar3) {
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  ((__return_storage_ptr__->
                   super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar11,&alpha);
      }
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(&Qalphas,&alpha);
      uVar10 = uVar10 + 1;
    }
    BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)&local_180,S,&Qalphas);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&VBalpha,&local_180);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_180);
    iVar4 = 0;
    for (__n = 0; uVar6 != __n; __n = __n + 1) {
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&stillNeedToBeImproved,__n);
      if ((*rVar14._M_p & rVar14._M_mask) != 0) {
        if (VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[__n] <=
            VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[__n]) {
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&stillNeedToBeImproved,__n);
          iVar4 = iVar4 + 1;
          *rVar14._M_p = *rVar14._M_p & ~rVar14._M_mask;
          local_248 = (ulong)((int)local_248 - 1);
        }
      }
    }
    if ((this->super_PerseusQFunctionPlanner).super_PerseusStationary.super_Perseus._m_verbose != 0)
    {
      poVar9 = std::operator<<((ostream *)&std::cout,"Added vectors for ");
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,(int)lVar12);
      std::operator<<(poVar9," (V ");
      poVar9 = std::ostream::_M_insert<double>
                         (VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)lVar12]);
      poVar9 = std::operator<<(poVar9," improved ");
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar4);
      poVar9 = std::operator<<(poVar9,")");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(&local_b0,&Gao);
  Perseus::BackupStageLeadOut((Perseus *)this,&local_b0);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&local_b0);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&Qalphas);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&Gao);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&V);
  AlphaVector::~AlphaVector(&alpha);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&stillNeedToBeImproved.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&VBalpha.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&VB.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete
PerseusBGPOMDPPlanner::BackupStageSamplingAlt(const BeliefSet &S,
                                              const QFunctionsDiscrete &Q) const
{
    vector<double> VB=BeliefValue::GetValues(S,Q),
        VBalpha;

    int nrB=VB.size(),
        nrNotImproved=nrB,
        nrS=GetPU()->GetNrStates(),
        k;
    vector<bool> stillNeedToBeImproved(nrB,true);
    QFunctionsDiscrete Q1(Q.size());
    AlphaVector alpha(nrS);

    ValueFunctionPOMDPDiscrete V=QFunctionsToValueFunction(Q);
    GaoVectorSet Gao=BackupStageLeadIn(V);

    ValueFunctionPOMDPDiscrete Qalphas;

    k=-1;

    while(nrNotImproved!=0)
    {
        Qalphas.clear();
        for(unsigned int a=0;a!=GetPU()->GetNrJointActions();++a)
        {
            // sample a belief index from the number of not improved beliefs
            k=SampleNotImprovedBeliefIndex(stillNeedToBeImproved,
                                           nrNotImproved);

            // backup the belief
            alpha=BeliefBackup(*S[k],a,Gao,Q);

            // check whether alpha improves the value of S[k]
            double x=S[k]->InnerProduct(alpha.GetValues());
            // if not, get copy from old value function
            if(x<VB[k]) //QB[a][k])//VB[k])
            {
#if DEBUG_PerseusBGPOMDPPlanner
                cout << "Getting n-1 vector for action " << a << ", belief "
                     << k << " (" << x << " < " << VB[k] << ")" << endl;
#endif
                alpha=BeliefValue::GetMaximizingVector(S,k,Q[a]);
            }
            else
            {
                if(GetVerbose())
                    cout << "Added vector for action " << a << ", belief " 
                         << k << " (Q " << x << " >= " << VB[k] << ")"
                         << endl;
            }
            
            // add alpha to Q1
            if(!VectorIsInValueFunction(alpha,Q1[a]))
                Q1[a].push_back(alpha);
            Qalphas.push_back(alpha);
        }

        // update which beliefs have been improved
        VBalpha=BeliefValue::GetValues(S,Qalphas);
        int nrImprovedByAlpha=0;
        for(int b=0;b!=nrB;b++)
            if(stillNeedToBeImproved[b] && VBalpha[b]>=VB[b])
            {
                stillNeedToBeImproved[b]=false;
                nrNotImproved--;
                nrImprovedByAlpha++;
            }
        
        if(GetVerbose())
            cout << "Added vectors for " << k << " (V " << VBalpha[k] 
                 << " improved " << nrImprovedByAlpha << ")" << endl;
    }

    BackupStageLeadOut(Gao);

    return(Q1);
}